

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

void do_osc(Terminal *term)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  Ldisc *ldisc;
  uint uVar4;
  wchar_t wVar5;
  char *pcVar6;
  char *pcVar7;
  size_t sVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  
  if (term->osc_w == true) {
    wVar5 = term->osc_strlen;
    term->osc_strlen = wVar5 + L'\xffffffff';
    if (wVar5 == L'\0') {
      return;
    }
    uVar4 = term->esc_args[0];
    lVar9 = (long)(wVar5 + L'\xffffffff');
    wVar5 = wVar5 + L'\xfffffffe';
    do {
      term->wordness[(byte)term->osc_string[lVar9]] = (short)uVar4;
      term->osc_strlen = wVar5;
      wVar5 = wVar5 + L'\xffffffff';
      bVar11 = lVar9 != 0;
      lVar9 = lVar9 + -1;
    } while (bVar11);
    return;
  }
  pcVar7 = term->osc_string;
  term->osc_string[term->osc_strlen] = '\0';
  uVar4 = term->esc_args[0];
  if ((int)uVar4 < 4) {
    bVar11 = uVar4 == 2;
    if (uVar4 < 2) {
      if (term->no_remote_wintitle == false) {
        safefree(term->icon_title);
        pcVar6 = dupstr(pcVar7);
        term->icon_title = pcVar6;
        term->icontitle_codepage = term->ucsdata->line_codepage;
        term->win_icon_title_pending = true;
        if (term->window_update_pending == false) {
          term->window_update_pending = true;
          queue_toplevel_callback(term_update_callback,term);
        }
      }
      if (term->esc_args[0] == 1) {
        return;
      }
      goto LAB_00112996;
    }
  }
  else {
    if (uVar4 == 4) {
      if (term->ldisc == (Ldisc *)0x0) {
        return;
      }
      if (*pcVar7 != '?') {
        return;
      }
      if (term->osc_string[1] != '\0') {
        return;
      }
      uVar10 = (ulong)term->esc_args[1];
      if (0x105 < uVar10) {
        return;
      }
      uVar1 = term->palette[uVar10].r;
      uVar2 = term->palette[uVar10].g;
      uVar3 = term->palette[uVar10].b;
      pcVar7 = dupprintf("\x1b]4;%u;rgb:%04x/%04x/%04x\a",uVar10,(ulong)CONCAT11(uVar1,uVar1),
                         (ulong)CONCAT11(uVar2,uVar2),(ulong)CONCAT11(uVar3,uVar3));
      ldisc = term->ldisc;
      sVar8 = strlen(pcVar7);
      ldisc_send(ldisc,pcVar7,(wchar_t)sVar8,false);
      safefree(pcVar7);
      return;
    }
    bVar11 = uVar4 == 0x15;
  }
  if (!bVar11) {
    return;
  }
LAB_00112996:
  if (term->no_remote_wintitle == false) {
    safefree(term->window_title);
    pcVar7 = dupstr(pcVar7);
    term->window_title = pcVar7;
    term->wintitle_codepage = term->ucsdata->line_codepage;
    term->win_title_pending = true;
    if (term->window_update_pending == false) {
      term->window_update_pending = true;
      queue_toplevel_callback(term_update_callback,term);
      return;
    }
  }
  return;
}

Assistant:

static void do_osc(Terminal *term)
{
    if (term->osc_w) {
        while (term->osc_strlen--)
            term->wordness[(unsigned char)
                term->osc_string[term->osc_strlen]] = term->esc_args[0];
    } else {
        term->osc_string[term->osc_strlen] = '\0';
        switch (term->esc_args[0]) {
          case 0:
          case 1:
            if (!term->no_remote_wintitle) {
                sfree(term->icon_title);
                term->icon_title = dupstr(term->osc_string);
                term->icontitle_codepage = term->ucsdata->line_codepage;
                term->win_icon_title_pending = true;
                term_schedule_update(term);
            }
            if (term->esc_args[0] == 1)
                break;
            /* fall through: parameter 0 means set both */
          case 2:
          case 21:
            if (!term->no_remote_wintitle) {
                sfree(term->window_title);
                term->window_title = dupstr(term->osc_string);
                term->wintitle_codepage = term->ucsdata->line_codepage;
                term->win_title_pending = true;
                term_schedule_update(term);
            }
            break;
          case 4:
            if (term->ldisc && !strcmp(term->osc_string, "?")) {
                unsigned index = term->esc_args[1];
                if (index < OSC4_NCOLOURS) {
                    rgb colour = term->palette[index];
                    char *reply_buf = dupprintf(
                        "\033]4;%u;rgb:%04x/%04x/%04x\007", index,
                        (unsigned)colour.r * 0x0101,
                        (unsigned)colour.g * 0x0101,
                        (unsigned)colour.b * 0x0101);
                    ldisc_send(term->ldisc, reply_buf, strlen(reply_buf),
                               false);
                    sfree(reply_buf);
                }
            }
            break;
        }
    }
}